

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

wchar_t archive_read_disk_can_descend(archive *_a)

{
  long lVar1;
  int iVar2;
  wchar_t wVar3;
  
  lVar1 = *(long *)&_a[1].archive_format;
  iVar2 = __archive_check_magic(_a,0xbadb0c5,6,"archive_read_disk_can_descend");
  wVar3 = L'\xffffffe2';
  if ((iVar2 != -0x1e) && (wVar3 = L'\0', *(int *)(lVar1 + 0x34) == 1)) {
    wVar3 = (wchar_t)(*(int *)(lVar1 + 0x1a0) != 0);
  }
  return wVar3;
}

Assistant:

int
archive_read_disk_can_descend(struct archive *_a)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	struct tree *t = a->tree;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
	    "archive_read_disk_can_descend");

	return (t->visit_type == TREE_REGULAR && t->descend);
}